

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_option_usage_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  ostream *poVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  stringstream out;
  ostream local_190 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])(&local_1e0,this,opt,1);
  poVar1 = local_190;
  ::std::operator<<(poVar1,(string *)&local_1e0);
  ::std::__cxx11::string::~string((string *)&local_1e0);
  if (opt->expected_max_ < 0x20000000) {
    if (opt->expected_max_ < 2) goto LAB_0010bf2f;
    poVar1 = ::std::operator<<(poVar1,"(");
    poVar1 = (ostream *)::std::ostream::operator<<((ostream *)poVar1,opt->expected_min_);
    pcVar2 = "x)";
  }
  else {
    pcVar2 = "...";
  }
  ::std::operator<<(poVar1,pcVar2);
LAB_0010bf2f:
  if ((opt->super_OptionBase<CLI::Option>).required_ == true) {
    ::std::__cxx11::stringbuf::str();
  }
  else {
    ::std::__cxx11::stringbuf::str();
    ::std::operator+(&local_1e0,"[",&local_1c0);
    ::std::operator+(__return_storage_ptr__,&local_1e0,"]");
    ::std::__cxx11::string::~string((string *)&local_1e0);
    ::std::__cxx11::string::~string((string *)&local_1c0);
  }
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option_usage(const Option *opt) const {
    // Note that these are positionals usages
    std::stringstream out;
    out << make_option_name(opt, true);
    if(opt->get_expected_max() >= detail::expected_max_vector_size)
        out << "...";
    else if(opt->get_expected_max() > 1)
        out << "(" << opt->get_expected() << "x)";

    return opt->get_required() ? out.str() : "[" + out.str() + "]";
}